

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::Utils::texture::update
          (texture *this,GLuint width,GLuint height,GLuint depth,GLenum format,GLenum type,
          GLvoid *data)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLuint __len;
  sockaddr *__addr;
  GLuint __fd;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar5;
  Functions *gl;
  GLenum type_local;
  GLenum format_local;
  GLuint depth_local;
  GLuint height_local;
  GLuint width_local;
  texture *this_local;
  long lVar4;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  __len = depth;
  __fd = width;
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  bind(this,__fd,__addr,__len);
  if ((this->m_is_array & 1U) == 0) {
    (**(code **)(lVar4 + 0x13b8))(0xde1,0,0,0,width,height,format,type,data);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"TexStorage2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x389);
  }
  else {
    (**(code **)(lVar4 + 0x13c0))
              (0x8c1a,0,0,0,0,width,height,depth,CONCAT44(uVar5,format),type,data);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"TexStorage2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x38f);
  }
  return;
}

Assistant:

void Utils::texture::update(glw::GLuint width, glw::GLuint height, glw::GLuint depth, glw::GLenum format,
							glw::GLenum type, glw::GLvoid* data)
{
	static const GLuint level = 0;

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bind();

	if (false == m_is_array)
	{
		gl.texSubImage2D(GL_TEXTURE_2D, level, 0 /* x */, 0 /* y */, width, height, format, type, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage2D");
	}
	else
	{
		gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, level, 0 /* x */, 0 /* y */, 0 /* z */, width, height, depth, format,
						 type, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage2D");
	}
}